

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-bookmarks.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  byte bVar2;
  int iVar3;
  ostream *poVar4;
  exception *e;
  undefined1 local_80 [8];
  vector<int,_std::allocator<int>_> numbers;
  QPDFOutlineDocumentHelper odh;
  QPDF local_38 [8];
  QPDF qpdf;
  char *password;
  char *filename;
  int arg;
  char **argv_local;
  int argc_local;
  
  whoami = (char *)QUtil::getWhoami(*argv);
  if ((argc == 2) && (iVar3 = strcmp(argv[1],"--version"), iVar3 == 0)) {
    poVar4 = std::operator<<((ostream *)&std::cout,whoami);
    poVar4 = std::operator<<(poVar4," version 1.5");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  filename._4_4_ = 1;
  while ((filename._4_4_ < argc && (*argv[filename._4_4_] == '-'))) {
    iVar3 = strcmp(argv[filename._4_4_],"--numbers");
    if (iVar3 == 0) {
      style = st_numbers;
    }
    else {
      iVar3 = strcmp(argv[filename._4_4_],"--lines");
      if (iVar3 == 0) {
        style = st_lines;
      }
      else {
        iVar3 = strcmp(argv[filename._4_4_],"--show-open");
        if (iVar3 == 0) {
          show_open = true;
        }
        else {
          iVar3 = strcmp(argv[filename._4_4_],"--show-targets");
          if (iVar3 == 0) {
            show_targets = true;
          }
          else {
            usage();
          }
        }
      }
    }
    filename._4_4_ = filename._4_4_ + 1;
  }
  if (argc <= filename._4_4_) {
    usage();
  }
  iVar3 = filename._4_4_ + 1;
  pcVar1 = argv[filename._4_4_];
  _qpdf = "";
  if (iVar3 < argc) {
    _qpdf = argv[iVar3];
    iVar3 = filename._4_4_ + 2;
  }
  filename._4_4_ = iVar3;
  if (filename._4_4_ != argc) {
    usage();
  }
  QPDF::QPDF(local_38);
  QPDF::processFile((char *)local_38,pcVar1);
  QPDFOutlineDocumentHelper::QPDFOutlineDocumentHelper
            ((QPDFOutlineDocumentHelper *)
             &numbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,local_38);
  bVar2 = QPDFOutlineDocumentHelper::hasOutlines();
  if ((bVar2 & 1) == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,pcVar1);
    poVar4 = std::operator<<(poVar4," has no bookmarks");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_80);
    if ((show_targets & 1U) != 0) {
      generate_page_map(local_38);
    }
    QPDFOutlineDocumentHelper::getTopLevelOutlines();
    extract_bookmarks((vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> *)
                      &e,(vector<int,_std::allocator<int>_> *)local_80);
    std::vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_>::~vector
              ((vector<QPDFOutlineObjectHelper,_std::allocator<QPDFOutlineObjectHelper>_> *)&e);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_80);
  }
  QPDFOutlineDocumentHelper::~QPDFOutlineDocumentHelper
            ((QPDFOutlineDocumentHelper *)
             &numbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  QPDF::~QPDF(local_38);
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    if ((argc == 2) && (strcmp(argv[1], "--version") == 0)) {
        std::cout << whoami << " version 1.5" << std::endl;
        exit(0);
    }

    int arg;
    for (arg = 1; arg < argc; ++arg) {
        if (argv[arg][0] == '-') {
            if (strcmp(argv[arg], "--numbers") == 0) {
                style = st_numbers;
            } else if (strcmp(argv[arg], "--lines") == 0) {
                style = st_lines;
            } else if (strcmp(argv[arg], "--show-open") == 0) {
                show_open = true;
            } else if (strcmp(argv[arg], "--show-targets") == 0) {
                show_targets = true;
            } else {
                usage();
            }
        } else {
            break;
        }
    }

    if (arg >= argc) {
        usage();
    }

    char const* filename = argv[arg++];
    char const* password = "";

    if (arg < argc) {
        password = argv[arg++];
    }
    if (arg != argc) {
        usage();
    }

    try {
        QPDF qpdf;
        qpdf.processFile(filename, password);

        QPDFOutlineDocumentHelper odh(qpdf);
        if (odh.hasOutlines()) {
            std::vector<int> numbers;
            if (show_targets) {
                generate_page_map(qpdf);
            }
            extract_bookmarks(odh.getTopLevelOutlines(), numbers);
        } else {
            std::cout << filename << " has no bookmarks" << std::endl;
        }
    } catch (std::exception& e) {
        std::cerr << whoami << " processing file " << filename << ": " << e.what() << std::endl;
        exit(2);
    }

    return 0;
}